

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O1

int VP8PutBit(VP8BitWriter *bw,int bit,int prob)

{
  int *piVar1;
  byte bVar2;
  int iVar3;
  
  iVar3 = prob * bw->range >> 8;
  if (bit != 0) {
    bw->value = bw->value + iVar3 + 1;
    iVar3 = bw->range - (iVar3 + 1);
  }
  bw->range = iVar3;
  if (iVar3 < 0x7f) {
    bVar2 = "\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
            [iVar3];
    bw->range = (uint)kNewRange[iVar3];
    bw->value = bw->value << (bVar2 & 0x1f);
    piVar1 = &bw->nb_bits;
    iVar3 = *piVar1;
    *piVar1 = *piVar1 + (uint)bVar2;
    if (*piVar1 != 0 && SCARRY4(iVar3,(uint)bVar2) == *piVar1 < 0) {
      Flush(bw);
    }
  }
  return bit;
}

Assistant:

int VP8PutBit(VP8BitWriter* const bw, int bit, int prob) {
  const int split = (bw->range * prob) >> 8;
  if (bit) {
    bw->value += split + 1;
    bw->range -= split + 1;
  } else {
    bw->range = split;
  }
  if (bw->range < 127) {   // emit 'shift' bits out and renormalize
    const int shift = kNorm[bw->range];
    bw->range = kNewRange[bw->range];
    bw->value <<= shift;
    bw->nb_bits += shift;
    if (bw->nb_bits > 0) Flush(bw);
  }
  return bit;
}